

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::EncryptAes256(ByteData *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  allocator<unsigned_char> *this;
  pointer *ppuVar1;
  pointer puVar2;
  bool bVar3;
  size_t sVar4;
  CfdException *pCVar5;
  uchar *puVar6;
  uchar *puVar7;
  size_type sVar8;
  size_type bytes_len;
  uchar *bytes_out;
  size_type len;
  allocator local_161;
  string local_160;
  CfdSourceLocation local_140;
  int local_128;
  allocator<unsigned_char> local_121;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  size_t data_size;
  string local_a8;
  CfdSourceLocation local_88;
  undefined1 local_6d;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  ByteData *local_20;
  ByteData *data_local;
  ByteData *key_local;
  
  local_20 = data;
  data_local = key;
  key_local = __return_storage_ptr__;
  sVar4 = ByteData::GetDataSize(key);
  if (sVar4 != 0x20) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x240;
    local_38.funcname = "EncryptAes256";
    logger::warn<>(&local_38,"wally_aes key size NG.");
    local_6d = 1;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"EncryptAes256Cbc key size error.",&local_59)
    ;
    CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_58);
    local_6d = 0;
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar3 = ByteData::IsEmpty(local_20);
  if (!bVar3) {
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)ByteData::GetDataSize(local_20);
    sVar4 = ByteData::GetDataSize(local_20);
    if ((sVar4 & 0xf) != 0) {
      sVar4 = ByteData::GetDataSize(local_20);
      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(((sVar4 >> 4) + 1) * 0x10);
    }
    puVar2 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    this = (allocator<unsigned_char> *)
           ((long)&key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<unsigned_char>::allocator(this);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,(size_type)puVar2,
               this);
    ::std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,data_local);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_20);
    puVar2 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ::std::allocator<unsigned_char>::allocator(&local_121);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,(size_type)puVar2,
               &local_121);
    ::std::allocator<unsigned_char>::~allocator(&local_121);
    puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    ppuVar1 = &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    memcpy(puVar6,puVar7,sVar8);
    ppuVar1 = &value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    local_128 = wally_aes(puVar6,sVar8,puVar7,bytes_len,1,bytes_out,len);
    if (local_128 != 0) {
      local_140.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                   ,0x2f);
      local_140.filename = local_140.filename + 1;
      local_140.line = 0x25d;
      local_140.funcname = "EncryptAes256";
      logger::warn<int&>(&local_140,"wally_aes NG[{}].",&local_128);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_160,"EncryptAes256 error.",&local_161);
      CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_160);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    return __return_storage_ptr__;
  }
  local_88.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  local_88.filename = local_88.filename + 1;
  local_88.line = 0x246;
  local_88.funcname = "EncryptAes256";
  logger::warn<>(&local_88,"wally_aes data is Empty.");
  data_size._6_1_ = 1;
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_a8,"EncryptAes256Cbc data isEmpty.",
             (allocator *)((long)&data_size + 7));
  CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_a8);
  data_size._6_1_ = 0;
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::EncryptAes256(const ByteData &key, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc key size error.");
  }

  if (data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "wally_aes data is Empty.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc data isEmpty.");
  }

  size_t data_size = data.GetDataSize();
  if (data.GetDataSize() % kAesBlockLength != 0) {
    data_size = ((data.GetDataSize() / kAesBlockLength) + 1) * kAesBlockLength;
  }
  std::vector<uint8_t> output(data_size);
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> value_data = data.GetBytes();
  std::vector<uint8_t> input(data_size);
  // To fill the end with 0
  memcpy(
      input.data(), reinterpret_cast<const uint8_t *>(value_data.data()),
      value_data.size());

  // Encrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key_data.data(), key_data.size(), input.data(), input.size(),
      AES_FLAG_ENCRYPT, output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256 error.");
  }

  return ByteData(output);
}